

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

bool compactor_is_valid_mode(char *filename,fdb_config *config)

{
  filemgr_ops *pfVar1;
  long in_RSI;
  char *in_RDI;
  filemgr_ops *ops;
  char path [1024];
  int fd;
  char local_428 [1036];
  int local_1c;
  long local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pfVar1 = get_filemgr_ops();
  if (*(char *)(local_18 + 0x2e) == '\x01') {
    local_1c = (*pfVar1->open)(local_10,0,0x1a4);
    if (local_1c != -3) {
      (*pfVar1->close)(local_1c);
      return false;
    }
  }
  else {
    if (*(char *)(local_18 + 0x2e) != '\0') {
      return false;
    }
    sprintf(local_428,"%s.meta",local_10);
    local_1c = (*pfVar1->open)(local_428,0,0x1a4);
    if (local_1c != -3) {
      (*pfVar1->close)(local_1c);
      return false;
    }
  }
  return true;
}

Assistant:

bool compactor_is_valid_mode(const char *filename, fdb_config *config)
{
    int fd;
    char path[MAX_FNAMELEN];
    struct filemgr_ops *ops;

    ops = get_filemgr_ops();

    if (config->compaction_mode == FDB_COMPACTION_AUTO) {
        // auto compaction mode: invalid when
        // the file '[filename]' exists
        fd = ops->open(filename, O_RDONLY, 0644);
        if (fd != FDB_RESULT_NO_SUCH_FILE) {
            ops->close(fd);
            return false;
        }

    } else if (config->compaction_mode == FDB_COMPACTION_MANUAL) {
        // manual compaction mode: invalid when
        // the file '[filename].meta' exists
        sprintf(path, "%s.meta", filename);
        fd = ops->open(path, O_RDONLY, 0644);
        if (fd != FDB_RESULT_NO_SUCH_FILE) {
            ops->close(fd);
            return false;
        }

    } else {
        // unknown mode
        return false;
    }

    return true;
}